

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void uv__work_done(uv_async_t *handle)

{
  undefined4 uVar1;
  QUEUE *q_1;
  long *plStack_38;
  int err;
  QUEUE wq;
  QUEUE *q;
  uv_loop_t *loop;
  uv__work *w;
  uv_async_t *handle_local;
  
  uv_mutex_lock((uv_mutex_t *)&handle[-1].flags);
  if ((undefined1 *)((long)&handle[-1].u + 0x18) == (undefined1 *)handle[-1].u.reserved[3]) {
    plStack_38 = (long *)&stack0xffffffffffffffc8;
    wq[0] = &stack0xffffffffffffffc8;
  }
  else {
    plStack_38 = (long *)handle[-1].u.reserved[3];
    wq[0] = handle[-1].next_closing;
    ((uv_handle_t *)wq[0])->data = &stack0xffffffffffffffc8;
    handle[-1].next_closing = (uv_handle_t *)plStack_38[1];
    (handle[-1].next_closing)->data = (void *)((long)&handle[-1].u + 0x18);
    plStack_38[1] = (long)&stack0xffffffffffffffc8;
  }
  uv_mutex_unlock((uv_mutex_t *)&handle[-1].flags);
  while (&stack0xffffffffffffffc8 != (long **)plStack_38) {
    wq[1] = plStack_38;
    *(long *)plStack_38[1] = *plStack_38;
    *(long *)(*plStack_38 + 8) = plStack_38[1];
    uVar1 = 0;
    if ((code *)plStack_38[-3] == uv__cancelled) {
      uVar1 = 0xffffff83;
    }
    (*(code *)plStack_38[-2])(plStack_38 + -3,uVar1);
  }
  return;
}

Assistant:

void uv__work_done(uv_async_t* handle) {
  struct uv__work* w;
  uv_loop_t* loop;
  QUEUE* q;
  QUEUE wq;
  int err;

  loop = container_of(handle, uv_loop_t, wq_async);
  uv_mutex_lock(&loop->wq_mutex);
  QUEUE_MOVE(&loop->wq, &wq);
  uv_mutex_unlock(&loop->wq_mutex);

  while (!QUEUE_EMPTY(&wq)) {
    q = QUEUE_HEAD(&wq);
    QUEUE_REMOVE(q);

    w = container_of(q, struct uv__work, wq);
    err = (w->work == uv__cancelled) ? UV_ECANCELED : 0;
    w->done(w, err);
  }
}